

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkDressMapIds(Aig_Man_t *pMiter,Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *vRes;
  void **ppvVar6;
  Vec_Int_t *__ptr;
  Vec_Int_t *__ptr_00;
  void *__s;
  void *__s_00;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  size_t __size;
  long lVar13;
  int *local_50;
  
  vRes = (Vec_Ptr_t *)malloc(0x10);
  vRes->nCap = 1000;
  vRes->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  vRes->pArray = ppvVar6;
  Abc_NtkDressMapSetPolarity(pNtk1);
  Abc_NtkDressMapSetPolarity(pNtk2);
  __ptr = Abc_NtkDressMapClasses(pMiter,pNtk1);
  __ptr_00 = Abc_NtkDressMapClasses(pMiter,pNtk2);
  iVar2 = pMiter->vObjs->nSize;
  iVar5 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar5 = iVar2;
  }
  if (iVar5 == 0) {
LAB_002b6812:
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar5 * 4);
    if (__s == (void *)0x0) goto LAB_002b6812;
    memset(__s,0,(long)iVar2 * 4);
  }
  iVar4 = __ptr->nSize;
  lVar13 = (long)iVar4;
  if (0 < lVar13) {
    piVar8 = __ptr->pArray;
    lVar10 = 0;
    do {
      iVar3 = piVar8[lVar10];
      if (-1 < (long)iVar3) {
        if (iVar2 <= iVar3) goto LAB_002b6b45;
        piVar1 = (int *)((long)__s + (long)iVar3 * 4);
        *piVar1 = *piVar1 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar13 != lVar10);
  }
  if (iVar5 != 0) {
    __s_00 = malloc((long)iVar5 << 2);
    if (__s_00 != (void *)0x0) {
      memset(__s_00,0,(long)iVar2 * 4);
      goto LAB_002b6879;
    }
  }
  __s_00 = (void *)0x0;
LAB_002b6879:
  iVar5 = __ptr_00->nSize;
  lVar10 = (long)iVar5;
  if (0 < lVar10) {
    piVar8 = __ptr_00->pArray;
    lVar11 = 0;
    do {
      iVar3 = piVar8[lVar11];
      if (-1 < (long)iVar3) {
        if (iVar2 <= iVar3) {
LAB_002b6b45:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = (int *)((long)__s_00 + (long)iVar3 * 4);
        *piVar1 = *piVar1 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar7->pArray = piVar8;
  if (0 < iVar4) {
    piVar8 = __ptr->pArray;
    lVar11 = 0;
    do {
      if (piVar8[lVar11] == 0) {
        iVar3 = Abc_ObjDressMakeId(pNtk1,(int)lVar11,0);
        Vec_IntPush(pVVar7,iVar3);
      }
      lVar11 = lVar11 + 1;
    } while (lVar13 != lVar11);
  }
  if (0 < iVar5) {
    piVar8 = __ptr_00->pArray;
    lVar11 = 0;
    do {
      if (piVar8[lVar11] == 0) {
        iVar3 = Abc_ObjDressMakeId(pNtk2,(int)lVar11,1);
        Vec_IntPush(pVVar7,iVar3);
      }
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  vRes->nSize = 1;
  *ppvVar6 = pVVar7;
  pVVar7 = (Vec_Int_t *)calloc(1,0x10);
  iVar3 = pMiter->vObjs->nSize;
  if ((long)iVar3 < 1) {
    local_50 = (int *)0x0;
  }
  else {
    __size = (long)iVar3 << 2;
    local_50 = (int *)malloc(__size);
    pVVar7->pArray = local_50;
    if (local_50 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar7->nCap = iVar3;
    memset(local_50,0xff,__size);
  }
  pVVar7->nSize = iVar3;
  if (0 < iVar4) {
    piVar8 = __ptr->pArray;
    lVar11 = 0;
    do {
      iVar4 = piVar8[lVar11];
      lVar12 = (long)iVar4;
      if (0 < lVar12) {
        if (iVar2 <= iVar4) goto LAB_002b6b64;
        if ((*(int *)((long)__s + lVar12 * 4) != 0) && (*(int *)((long)__s_00 + lVar12 * 4) != 0)) {
          pVVar9 = Abc_ObjDressClass(vRes,pVVar7,iVar4);
          iVar4 = Abc_ObjDressMakeId(pNtk1,(int)lVar11,0);
          Vec_IntPush(pVVar9,iVar4);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar13 != lVar11);
  }
  if (0 < iVar5) {
    piVar8 = __ptr_00->pArray;
    lVar13 = 0;
    do {
      iVar5 = piVar8[lVar13];
      lVar11 = (long)iVar5;
      if (0 < lVar11) {
        if (iVar2 <= iVar5) {
LAB_002b6b64:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((*(int *)((long)__s + lVar11 * 4) != 0) && (*(int *)((long)__s_00 + lVar11 * 4) != 0)) {
          pVVar9 = Abc_ObjDressClass(vRes,pVVar7,iVar5);
          iVar5 = Abc_ObjDressMakeId(pNtk2,(int)lVar13,1);
          Vec_IntPush(pVVar9,iVar5);
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar10 != lVar13);
  }
  if (local_50 != (int *)0x0) {
    free(local_50);
  }
  free(pVVar7);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  return vRes;
}

Assistant:

Vec_Ptr_t * Abc_NtkDressMapIds( Aig_Man_t * pMiter, Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2 )
{
    Vec_Ptr_t * vRes;
    Vec_Int_t * vId2Lit1, * vId2Lit2, * vCounts0, * vCounts1, * vClassC, * vClass2Num;
    int i, Class;
    // start the classes
    vRes = Vec_PtrAlloc( 1000 );
    // set polarity of the nodes
    Abc_NtkDressMapSetPolarity( pNtk1 );
    Abc_NtkDressMapSetPolarity( pNtk2 );
    // create mapping of node IDs of pNtk1/pNtk2 into the IDs of equiv classes of pMiter
    vId2Lit1 = Abc_NtkDressMapClasses( pMiter, pNtk1 );
    vId2Lit2 = Abc_NtkDressMapClasses( pMiter, pNtk2 );
    // count the number of nodes in each equivalence class
    vCounts0 = Vec_IntStart( Aig_ManObjNumMax(pMiter) );
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class >= 0 )
            Vec_IntAddToEntry( vCounts0, Class, 1 );
    vCounts1 = Vec_IntStart( Aig_ManObjNumMax(pMiter) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class >= 0 )
            Vec_IntAddToEntry( vCounts1, Class, 1 );
    // get the costant class
    vClassC = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class == 0 )
            Vec_IntPush( vClassC, Abc_ObjDressMakeId(pNtk1, i, 0) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class == 0 )
            Vec_IntPush( vClassC, Abc_ObjDressMakeId(pNtk2, i, 1) );
    Vec_PtrPush( vRes, vClassC );
    // map repr node IDs into class numbers
    vClass2Num = Vec_IntAlloc( 0 );
    Vec_IntFill( vClass2Num, Aig_ManObjNumMax(pMiter), -1 );
    // keep classes having at least one element from pNtk1 and one from pNtk2
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class > 0 && Vec_IntEntry(vCounts0, Class) && Vec_IntEntry(vCounts1, Class) )
            Vec_IntPush( Abc_ObjDressClass(vRes, vClass2Num, Class), Abc_ObjDressMakeId(pNtk1, i, 0) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class > 0 && Vec_IntEntry(vCounts0, Class) && Vec_IntEntry(vCounts1, Class) )
            Vec_IntPush( Abc_ObjDressClass(vRes, vClass2Num, Class), Abc_ObjDressMakeId(pNtk2, i, 1) );
    // package them accordingly
    Vec_IntFree( vClass2Num );
    Vec_IntFree( vCounts0 );
    Vec_IntFree( vCounts1 );
    Vec_IntFree( vId2Lit1 );
    Vec_IntFree( vId2Lit2 );
    return vRes;
}